

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteCreateIndex(WriteAheadLog *this,IndexCatalogEntry *entry)

{
  DataTableInfo *pDVar1;
  IndexCatalogEntry *local_5c8;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,CREATE_INDEX);
  local_5c8 = entry;
  Serializer::WriteProperty<duckdb::IndexCatalogEntry_const*>
            (&serializer.serializer.super_Serializer,0x65,"index_catalog_entry",&local_5c8);
  pDVar1 = DuckIndexEntry::GetDataTableInfo((DuckIndexEntry *)entry);
  SerializeIndex(this->database,&serializer,&pDVar1->indexes,
                 &(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateIndex(const IndexCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_INDEX);
	serializer.WriteProperty(101, "index_catalog_entry", &entry);

	// Serialize the index data to the persistent storage and write the metadata.
	auto &index_entry = entry.Cast<DuckIndexEntry>();
	auto &list = index_entry.GetDataTableInfo().GetIndexes();
	SerializeIndex(database, serializer, list, index_entry.name);
	serializer.End();
}